

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

shared_ptr<interface1> __thiscall
boost::ext::di::v1_3_0::core::successful::any_type_ref::operator_cast_to_shared_ptr
          (any_type_ref *this)

{
  wrapper<std::shared_ptr<interface1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_implementation,_std::shared_ptr<implementation>_&>_>
  __r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<interface1> sVar1;
  
  __r = injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<interface1,interface2>,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
        ::
        create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,std::shared_ptr<interface1>,boost::ext::di::v1_3_0::no_name>
                  ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::concepts::any_of<interface1,interface2>,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                    *)*in_RSI);
  std::__shared_ptr<interface1,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<implementation,void>
            ((__shared_ptr<interface1,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<implementation,_(__gnu_cxx::_Lock_policy)2> *)__r.wrapper_.object);
  sVar1.super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<interface1>)sVar1.super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

operator T() {
    return static_cast<const core::injector__<TInjector>&>(injector_).create_successful_impl(aux::type<T>{});
  }